

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void compute_square_diff(uint8_t *ref,int ref_offset,int ref_stride,uint8_t *tgt,int tgt_offset,
                        int tgt_stride,int height,int width,int is_high_bitdepth,
                        uint32_t *square_diff)

{
  ushort uVar1;
  ushort uVar2;
  int local_58;
  uint32_t diff;
  uint16_t tgt_value;
  uint16_t ref_value;
  int j;
  int i;
  int idx;
  int tgt_idx;
  int ref_idx;
  uint16_t *tgt16;
  uint16_t *ref16;
  int tgt_stride_local;
  int tgt_offset_local;
  uint8_t *tgt_local;
  int ref_stride_local;
  int ref_offset_local;
  uint8_t *ref_local;
  
  ref_idx = 0;
  tgt_idx = 0;
  idx = 0;
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      if (is_high_bitdepth == 0) {
        uVar1 = (ushort)ref[ref_offset + ref_idx];
        uVar2 = (ushort)tgt[tgt_offset + tgt_idx];
      }
      else {
        uVar1 = *(ushort *)((long)ref * 2 + (long)(ref_offset + ref_idx) * 2);
        uVar2 = *(ushort *)((long)tgt * 2 + (long)(tgt_offset + tgt_idx) * 2);
      }
      if (uVar2 < uVar1) {
        local_58 = (uint)uVar1 - (uint)uVar2;
      }
      else {
        local_58 = (uint)uVar2 - (uint)uVar1;
      }
      square_diff[idx] = local_58 * local_58;
      ref_idx = ref_idx + 1;
      tgt_idx = tgt_idx + 1;
      idx = idx + 1;
    }
    ref_idx = (ref_stride - width) + ref_idx;
    tgt_idx = (tgt_stride - width) + tgt_idx;
  }
  return;
}

Assistant:

static inline void compute_square_diff(const uint8_t *ref, const int ref_offset,
                                       const int ref_stride, const uint8_t *tgt,
                                       const int tgt_offset,
                                       const int tgt_stride, const int height,
                                       const int width,
                                       const int is_high_bitdepth,
                                       uint32_t *square_diff) {
  const uint16_t *ref16 = CONVERT_TO_SHORTPTR(ref);
  const uint16_t *tgt16 = CONVERT_TO_SHORTPTR(tgt);

  int ref_idx = 0;
  int tgt_idx = 0;
  int idx = 0;
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const uint16_t ref_value = is_high_bitdepth ? ref16[ref_offset + ref_idx]
                                                  : ref[ref_offset + ref_idx];
      const uint16_t tgt_value = is_high_bitdepth ? tgt16[tgt_offset + tgt_idx]
                                                  : tgt[tgt_offset + tgt_idx];
      const uint32_t diff = (ref_value > tgt_value) ? (ref_value - tgt_value)
                                                    : (tgt_value - ref_value);
      square_diff[idx] = diff * diff;

      ++ref_idx;
      ++tgt_idx;
      ++idx;
    }
    ref_idx += (ref_stride - width);
    tgt_idx += (tgt_stride - width);
  }
}